

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

number_validator<long> __thiscall goodform::sub_form::int64(sub_form *this)

{
  bool bVar1;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar2;
  undefined8 *in_RSI;
  number_validator<long> nVar3;
  int64_t val;
  allocator<char> local_61;
  any *local_60;
  string local_58;
  error_message local_38;
  
  bVar1 = convert<long>((any *)in_RSI[1],(long *)&local_60);
  lVar2 = extraout_RDX;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"NOT A int64_t",&local_61);
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    lVar2 = extraout_RDX_00;
  }
  this->error_ = (error_message *)*in_RSI;
  this->variant_ = local_60;
  nVar3.value_ = lVar2;
  nVar3.error_ = (error_message *)this;
  return nVar3;
}

Assistant:

number_validator<std::int64_t> sub_form::int64()
  {
    std::int64_t val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A int64_t");
    return number_validator<std::int64_t>(val, this->error_);
  }